

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  byte bVar1;
  long lVar2;
  SrcList *pSVar3;
  Vdbe *p;
  WhereLoop *pWVar4;
  Table *pTVar5;
  char *pcVar6;
  long lVar7;
  uint i;
  long in_FS_OFFSET;
  StrAccum local_c8;
  char zBuf [100];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = pWInfo->pTabList;
  bVar1 = pLevel->iFrom;
  local_c8.db = pParse->db;
  p = pParse->pVdbe;
  local_c8.zText = zBuf;
  zBuf[0x50] = -0x56;
  zBuf[0x51] = -0x56;
  zBuf[0x52] = -0x56;
  zBuf[0x53] = -0x56;
  zBuf[0x54] = -0x56;
  zBuf[0x55] = -0x56;
  zBuf[0x56] = -0x56;
  zBuf[0x57] = -0x56;
  zBuf[0x58] = -0x56;
  zBuf[0x59] = -0x56;
  zBuf[0x5a] = -0x56;
  zBuf[0x5b] = -0x56;
  zBuf[0x5c] = -0x56;
  zBuf[0x5d] = -0x56;
  zBuf[0x5e] = -0x56;
  zBuf[0x5f] = -0x56;
  zBuf[0x40] = -0x56;
  zBuf[0x41] = -0x56;
  zBuf[0x42] = -0x56;
  zBuf[0x43] = -0x56;
  zBuf[0x44] = -0x56;
  zBuf[0x45] = -0x56;
  zBuf[0x46] = -0x56;
  zBuf[0x47] = -0x56;
  zBuf[0x48] = -0x56;
  zBuf[0x49] = -0x56;
  zBuf[0x4a] = -0x56;
  zBuf[0x4b] = -0x56;
  zBuf[0x4c] = -0x56;
  zBuf[0x4d] = -0x56;
  zBuf[0x4e] = -0x56;
  zBuf[0x4f] = -0x56;
  zBuf[0x30] = -0x56;
  zBuf[0x31] = -0x56;
  zBuf[0x32] = -0x56;
  zBuf[0x33] = -0x56;
  zBuf[0x34] = -0x56;
  zBuf[0x35] = -0x56;
  zBuf[0x36] = -0x56;
  zBuf[0x37] = -0x56;
  zBuf[0x38] = -0x56;
  zBuf[0x39] = -0x56;
  zBuf[0x3a] = -0x56;
  zBuf[0x3b] = -0x56;
  zBuf[0x3c] = -0x56;
  zBuf[0x3d] = -0x56;
  zBuf[0x3e] = -0x56;
  zBuf[0x3f] = -0x56;
  zBuf[0x20] = -0x56;
  zBuf[0x21] = -0x56;
  zBuf[0x22] = -0x56;
  zBuf[0x23] = -0x56;
  zBuf[0x24] = -0x56;
  zBuf[0x25] = -0x56;
  zBuf[0x26] = -0x56;
  zBuf[0x27] = -0x56;
  zBuf[0x28] = -0x56;
  zBuf[0x29] = -0x56;
  zBuf[0x2a] = -0x56;
  zBuf[0x2b] = -0x56;
  zBuf[0x2c] = -0x56;
  zBuf[0x2d] = -0x56;
  zBuf[0x2e] = -0x56;
  zBuf[0x2f] = -0x56;
  zBuf[0x10] = -0x56;
  zBuf[0x11] = -0x56;
  zBuf[0x12] = -0x56;
  zBuf[0x13] = -0x56;
  zBuf[0x14] = -0x56;
  zBuf[0x15] = -0x56;
  zBuf[0x16] = -0x56;
  zBuf[0x17] = -0x56;
  zBuf[0x18] = -0x56;
  zBuf[0x19] = -0x56;
  zBuf[0x1a] = -0x56;
  zBuf[0x1b] = -0x56;
  zBuf[0x1c] = -0x56;
  zBuf[0x1d] = -0x56;
  zBuf[0x1e] = -0x56;
  zBuf[0x1f] = -0x56;
  zBuf[0] = -0x56;
  zBuf[1] = -0x56;
  zBuf[2] = -0x56;
  zBuf[3] = -0x56;
  zBuf[4] = -0x56;
  zBuf[5] = -0x56;
  zBuf[6] = -0x56;
  zBuf[7] = -0x56;
  zBuf[8] = -0x56;
  zBuf[9] = -0x56;
  zBuf[10] = -0x56;
  zBuf[0xb] = -0x56;
  zBuf[0xc] = -0x56;
  zBuf[0xd] = -0x56;
  zBuf[0xe] = -0x56;
  zBuf[0xf] = -0x56;
  zBuf[0x60] = -0x56;
  zBuf[0x61] = -0x56;
  zBuf[0x62] = -0x56;
  zBuf[99] = -0x56;
  local_c8.nAlloc = 100;
  local_c8.mxAlloc = 1000000000;
  local_c8.nChar = 0;
  local_c8.accError = '\0';
  local_c8.printfFlags = '\x01';
  local_c8._30_2_ = 0xaaaa;
  sqlite3_str_appendf(&local_c8,"BLOOM FILTER ON %S (",pSVar3->a + bVar1);
  pWVar4 = pLevel->pWLoop;
  if ((pWVar4->wsFlags & 0x100) == 0) {
    for (i = (uint)pWVar4->nSkip; i < (pWVar4->u).btree.nEq; i = i + 1) {
      pcVar6 = explainIndexColumnName((pWVar4->u).btree.pIndex,i);
      if (pWVar4->nSkip < i) {
        sqlite3_str_append(&local_c8," AND ",5);
      }
      sqlite3_str_appendf(&local_c8,"%s=?",pcVar6);
    }
  }
  else {
    pTVar5 = pSVar3->a[bVar1].pSTab;
    lVar7 = (long)pTVar5->iPKey;
    if (lVar7 < 0) {
      sqlite3_str_appendf(&local_c8,"rowid=?");
    }
    else {
      sqlite3_str_appendf(&local_c8,"%s=?",pTVar5->aCol[lVar7].zCnName);
    }
  }
  sqlite3_str_append(&local_c8,")",1);
  pcVar6 = sqlite3StrAccumFinish(&local_c8);
  sqlite3VdbeAddOp4(p,0xbc,p->nOp,pParse->addrExplain,0,pcVar6,-6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pSTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}